

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTextImpl.cpp
# Opt level: O3

DOMText * __thiscall xercesc_4_0::DOMTextImpl::replaceWholeText(DOMTextImpl *this,XMLCh *newText)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  long *plVar5;
  DOMTextImpl *pDVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  long *plVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMException *this_00;
  undefined4 extraout_var_02;
  MemoryManager **ppMVar11;
  undefined4 extraout_var_03;
  DOMTextImpl *pDVar12;
  DOMTextImpl *pDVar13;
  long *plVar3;
  
  iVar2 = (*(this->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  plVar10 = plVar3 + 2;
  uVar4 = (**(code **)(*plVar3 + 0x68))(plVar3);
  plVar5 = (long *)(**(code **)(plVar3[2] + 0x18))(plVar10,uVar4,0xffff,0,1);
  (**(code **)(*plVar5 + 0x70))(plVar5,this);
  pDVar6 = (DOMTextImpl *)(**(code **)(*plVar5 + 0x60))(plVar5);
  pDVar13 = this;
  if ((pDVar6 != (DOMTextImpl *)0x0) &&
     (iVar2 = (*(pDVar6->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])
                        (pDVar6), iVar2 != 1)) {
    while (pDVar12 = pDVar6,
          iVar2 = (*(pDVar12->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])
                            (pDVar12), iVar2 != 8) {
      iVar2 = (*(pDVar12->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])
                        (pDVar12);
      if (((iVar2 == 7) ||
          (pDVar6 = (DOMTextImpl *)(**(code **)(*plVar5 + 0x60))(plVar5), pDVar13 = pDVar12,
          pDVar6 == (DOMTextImpl *)0x0)) ||
         (iVar2 = (*(pDVar6->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])
                            (pDVar6), iVar2 == 1)) break;
    }
  }
  uVar4 = (**(code **)(*plVar5 + 0x30))(plVar5);
  plVar7 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
  if (plVar7 != (long *)0x0) {
    while (((iVar2 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar2 != 1 &&
            (iVar2 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar2 != 8)) &&
           (iVar2 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar2 != 7))) {
      iVar2 = (**(code **)(*plVar7 + 0x20))(plVar7);
      if (iVar2 == 5) {
        plVar7 = (long *)(**(code **)(*plVar10 + 0x18))(plVar10,plVar7,0xffff,0,1);
        while( true ) {
          lVar8 = (**(code **)(*plVar7 + 0x68))(plVar7);
          if (lVar8 == 0) break;
          plVar9 = (long *)(**(code **)(*plVar7 + 0x30))(plVar7);
          uVar1 = (**(code **)(*plVar9 + 0x20))(plVar9);
          if ((uVar1 & 0xfffe) != 4 && uVar1 != 3) {
            this_00 = (DOMException *)__cxa_allocate_exception(0x28);
            iVar2 = (*(this->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])
                              (this);
            if (CONCAT44(extraout_var_02,iVar2) == 0) {
              ppMVar11 = &XMLPlatformUtils::fgMemoryManager;
            }
            else {
              iVar2 = (*(this->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode
                        [0xc])(this);
              ppMVar11 = (MemoryManager **)(CONCAT44(extraout_var_03,iVar2) + 0x158);
            }
            DOMException::DOMException(this_00,7,0,*ppMVar11);
            goto LAB_0027e2b1;
          }
        }
        (**(code **)(*plVar7 + 0x78))(plVar7);
      }
      plVar7 = (long *)(**(code **)(*plVar5 + 0x68))(plVar5);
      if (plVar7 == (long *)0x0) break;
    }
  }
  if ((newText == (XMLCh *)0x0) || (*newText == L'\0')) {
    pDVar13 = (DOMTextImpl *)0x0;
  }
  else {
    plVar10 = (long *)__dynamic_cast(pDVar13,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                     0xfffffffffffffffe);
    if ((plVar10 == (long *)0x0) || (lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10), lVar8 == 0)) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
LAB_0027e2b1:
      __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
    }
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (((*(ushort *)(lVar8 + 0x10) & 1) == 0) &&
       ((iVar2 = (*(pDVar13->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])
                           (pDVar13), iVar2 == 3 ||
        (iVar2 = (*(pDVar13->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])
                           (pDVar13), iVar2 == 4)))) {
      (*(pDVar13->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0x13])
                (pDVar13,newText);
    }
    else {
      iVar2 = (*(this->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])(this);
      pDVar6 = (DOMTextImpl *)
               (**(code **)(*plVar3 + 0x28 + (ulong)(iVar2 != 3) * 0x10))(plVar3,newText);
      iVar2 = (*(pDVar13->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[5])
                        (pDVar13);
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x70))
                ((long *)CONCAT44(extraout_var_00,iVar2),pDVar6,pDVar13);
      pDVar13 = pDVar6;
    }
  }
  (**(code **)(*plVar5 + 0x70))(plVar5,uVar4);
  pDVar6 = (DOMTextImpl *)(**(code **)(*plVar5 + 0x68))(plVar5);
  while ((((pDVar6 != (DOMTextImpl *)0x0 &&
           (iVar2 = (*(pDVar6->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])
                              (pDVar6), iVar2 != 1)) &&
          (iVar2 = (*(pDVar6->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])
                             (pDVar6), iVar2 != 8)) &&
         (iVar2 = (*(pDVar6->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[4])
                            (pDVar6), iVar2 != 7))) {
    if (pDVar6 != pDVar13) {
      (**(code **)(*plVar5 + 0x60))(plVar5);
      iVar2 = (*(pDVar6->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[5])
                        (pDVar6);
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x80))
                ((long *)CONCAT44(extraout_var_01,iVar2),pDVar6);
      (*(pDVar6->super_DOMText).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0x27])(pDVar6);
    }
    pDVar6 = (DOMTextImpl *)(**(code **)(*plVar5 + 0x68))(plVar5);
  }
  (**(code **)(*plVar5 + 0x78))(plVar5);
  return &pDVar13->super_DOMText;
}

Assistant:

DOMText* DOMTextImpl::replaceWholeText(const XMLCh* newText)
{
    DOMDocument *doc = getOwnerDocument();
    DOMTreeWalker* pWalker=doc->createTreeWalker(doc->getDocumentElement(), DOMNodeFilter::SHOW_ALL, NULL, true);
    pWalker->setCurrentNode((DOMNode*)this);
    // Logically-adjacent text nodes are Text or CDATASection nodes that can be visited sequentially in document order or in
    // reversed document order without entering, exiting, or passing over Element, Comment, or ProcessingInstruction nodes.
    DOMNode* pFirstTextNode=this;
    DOMNode* prevNode;
    while((prevNode=pWalker->previousNode())!=NULL)
    {
        if(prevNode->getNodeType()==ELEMENT_NODE || prevNode->getNodeType()==COMMENT_NODE || prevNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
        pFirstTextNode=prevNode;
    }
    // before doing any change we need to check if we are going to remove an entity reference that doesn't contain just text
    DOMNode* pCurrentNode=pWalker->getCurrentNode();
    DOMNode* nextNode;
    while((nextNode=pWalker->nextNode())!=NULL)
    {
        if(nextNode->getNodeType()==ELEMENT_NODE || nextNode->getNodeType()==COMMENT_NODE || nextNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
        if(nextNode->getNodeType()==ENTITY_REFERENCE_NODE)
        {
            DOMTreeWalker* pInnerWalker=doc->createTreeWalker(nextNode, DOMNodeFilter::SHOW_ALL, NULL, true);
            while(pInnerWalker->nextNode())
            {
                short nodeType=pInnerWalker->getCurrentNode()->getNodeType();
                if(nodeType!=ENTITY_REFERENCE_NODE && nodeType!=TEXT_NODE && nodeType!=CDATA_SECTION_NODE)
                    throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
            }
            pInnerWalker->release();
        }
    }
    DOMText* retVal=NULL;
    // if the first node in the chain is a text node, replace its content, otherwise create a new node
    if(newText && *newText)
    {
        if(!castToNodeImpl(pFirstTextNode)->isReadOnly() && (pFirstTextNode->getNodeType()==TEXT_NODE || pFirstTextNode->getNodeType()==CDATA_SECTION_NODE))
        {
            pFirstTextNode->setNodeValue(newText);
            retVal=(DOMText*)pFirstTextNode;
        }
        else
        {
            if(getNodeType()==TEXT_NODE)
                retVal=doc->createTextNode(newText);
            else
                retVal=doc->createCDATASection(newText);
            pFirstTextNode->getParentNode()->insertBefore(retVal, pFirstTextNode);
        }
    }
    // now delete all the following text nodes
    pWalker->setCurrentNode(pCurrentNode);
    while((nextNode=pWalker->nextNode())!=NULL)
    {
        if(nextNode->getNodeType()==ELEMENT_NODE || nextNode->getNodeType()==COMMENT_NODE || nextNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
        if(nextNode!=retVal)
        {
            // keep the tree walker valid
            pWalker->previousNode();
            nextNode->getParentNode()->removeChild(nextNode);
            nextNode->release();
        }
    }
    pWalker->release();
    return retVal;
}